

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ManPrintVerbose(Hop_Man_t *p,int fHaig)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pObj_00;
  int local_2c;
  int i;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fHaig_local;
  Hop_Man_t *p_local;
  
  printf("PIs: ");
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->vPis,local_2c);
    printf(" %p",pvVar2);
  }
  printf("\n");
  p_00 = Hop_ManDfs(p);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Hop_Obj_t *)Vec_PtrEntry(p_00,local_2c);
    Hop_ObjPrintVerbose(pObj_00,fHaig);
    printf("\n");
  }
  printf("\n");
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Hop_ManPrintVerbose( Hop_Man_t * p, int fHaig )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Hop_ManForEachPi( p, pObj, i )
        printf( " %p", pObj );
    printf( "\n" );
    vNodes = Hop_ManDfs( p );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
        Hop_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );
}